

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UILighting.cpp
# Opt level: O0

void UI::LightingMenuItems
               (shared_ptr<myvk::CommandPool> *command_pool,shared_ptr<Lighting> *lighting,
               char **open_modal)

{
  bool bVar1;
  element_type *peVar2;
  element_type *this;
  VkExtent3D *pVVar3;
  element_type *peVar4;
  undefined8 *in_RDX;
  Queue *in_RSI;
  float *in_RDI;
  float unaff_retaddr;
  float unaff_retaddr_00;
  float *in_stack_00000008;
  EnvironmentMap *in_stack_00000010;
  bool active;
  LightTypes type;
  bool in_stack_000000e7;
  char *in_stack_000000e8;
  bool in_stack_00000117;
  char *in_stack_00000118;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  uint32_t uVar5;
  float in_stack_ffffffffffffffd0;
  float in_stack_ffffffffffffffd4;
  float in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar6;
  LightTypes LVar7;
  float v_degrees_max;
  
  bVar1 = ImGui::BeginMenu(in_stack_00000118,in_stack_00000117);
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<Lighting,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Lighting,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x18aa57);
    LVar7 = peVar2->m_light_type;
    uVar6 = CONCAT13(LVar7 == kConstantColor,(int3)in_stack_ffffffffffffffe0);
    bVar1 = ImGui::RadioButton(in_stack_000000e8,in_stack_000000e7);
    if (bVar1) {
      peVar2 = std::__shared_ptr_access<Lighting,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Lighting,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                          )0x18aa90);
      peVar2->m_light_type = kConstantColor;
    }
    if ((uVar6 & 0x1000000) == 0) {
      ImGui::PushDisabled();
    }
    peVar2 = std::__shared_ptr_access<Lighting,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Lighting,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x18aaac);
    glm::vec<3,_float,_(glm::qualifier)0>::operator[](&peVar2->m_sun_radiance,0);
    ImGui::DragFloat3((char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),in_RDI,
                      (float)((ulong)in_RSI >> 0x20),SUB84(in_RSI,0),(float)((ulong)in_RDX >> 0x20),
                      (char *)CONCAT44(LVar7,uVar6),(ImGuiSliderFlags)in_stack_ffffffffffffffdc);
    if ((uVar6 & 0x1000000) == 0) {
      ImGui::PopDisabled();
    }
    ImGui::Separator();
    uVar6 = CONCAT13(LVar7 == kEnvironmentMap,(int3)uVar6);
    bVar1 = ImGui::RadioButton(in_stack_000000e8,in_stack_000000e7);
    if (bVar1) {
      peVar2 = std::__shared_ptr_access<Lighting,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Lighting,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                          )0x18ab29);
      peVar2->m_light_type = kEnvironmentMap;
    }
    if ((uVar6 & 0x1000000) == 0) {
      ImGui::PushDisabled();
    }
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd8,0.0,0.0);
    bVar1 = ImGui::Button((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                          (ImVec2 *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    if (bVar1) {
      *in_RDX = "Load Environment Map";
    }
    peVar2 = std::__shared_ptr_access<Lighting,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Lighting,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x18ab7b);
    v_degrees_max = (float)((ulong)in_RDX >> 0x20);
    Lighting::GetEnvironmentMapPtr(peVar2);
    std::__shared_ptr_access<EnvironmentMap,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<EnvironmentMap,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x18ab8b);
    bVar1 = EnvironmentMap::Empty((EnvironmentMap *)0x18ab93);
    if (!bVar1) {
      ImGui::SameLine(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd0,0.0,0.0);
      bVar1 = ImGui::Button((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                            (ImVec2 *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8))
      ;
      if (bVar1) {
        this = std::__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x18abdc);
        myvk::CommandPool::GetQueuePtr(this);
        std::__shared_ptr_access<myvk::Queue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<myvk::Queue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x18abec);
        myvk::Queue::WaitIdle(in_RSI);
        peVar2 = std::__shared_ptr_access<Lighting,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Lighting,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x18abfe);
        Lighting::GetEnvironmentMapPtr(peVar2);
        std::__shared_ptr_access<EnvironmentMap,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<EnvironmentMap,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x18ac0e);
        EnvironmentMap::Reset(in_stack_00000010);
      }
      else {
        ImGui::SameLine(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
        peVar2 = std::__shared_ptr_access<Lighting,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Lighting,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x18ac32);
        Lighting::GetEnvironmentMapPtr(peVar2);
        std::__shared_ptr_access<EnvironmentMap,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<EnvironmentMap,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x18ac42);
        pVVar3 = EnvironmentMap::GetImageExtent((EnvironmentMap *)0x18ac4a);
        uVar5 = pVVar3->width;
        peVar2 = std::__shared_ptr_access<Lighting,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Lighting,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x18ac5a);
        Lighting::GetEnvironmentMapPtr(peVar2);
        std::__shared_ptr_access<EnvironmentMap,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<EnvironmentMap,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x18ac6a);
        pVVar3 = EnvironmentMap::GetImageExtent((EnvironmentMap *)0x18ac72);
        ImGui::Text("(%d x %d)",(ulong)uVar5,(ulong)pVVar3->height);
      }
    }
    peVar2 = std::__shared_ptr_access<Lighting,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Lighting,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x18ac93);
    Lighting::GetEnvironmentMapPtr(peVar2);
    std::__shared_ptr_access<EnvironmentMap,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<EnvironmentMap,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x18aca3);
    ImGui::InputFloat((char *)in_stack_00000010,in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
                      (char *)in_RDI,(ImGuiInputTextFlags)((ulong)in_RSI >> 0x20));
    peVar2 = std::__shared_ptr_access<Lighting,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Lighting,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x18accf);
    Lighting::GetEnvironmentMapPtr(peVar2);
    peVar4 = std::__shared_ptr_access<EnvironmentMap,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<EnvironmentMap,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x18acdf);
    if (peVar4->m_multiplier <= 0.0 && peVar4->m_multiplier != 0.0) {
      peVar2 = std::__shared_ptr_access<Lighting,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Lighting,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                          )0x18acf2);
      Lighting::GetEnvironmentMapPtr(peVar2);
      peVar4 = std::__shared_ptr_access<EnvironmentMap,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<EnvironmentMap,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x18ad02);
      peVar4->m_multiplier = 0.0;
    }
    peVar2 = std::__shared_ptr_access<Lighting,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Lighting,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x18ad14);
    Lighting::GetEnvironmentMapPtr(peVar2);
    std::__shared_ptr_access<EnvironmentMap,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<EnvironmentMap,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x18ad24);
    ImGui::DragAngle((char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),in_RDI,
                     (float)((ulong)in_RSI >> 0x20),SUB84(in_RSI,0),v_degrees_max,
                     (char *)CONCAT44(LVar7,uVar6),(ImGuiSliderFlags)in_stack_ffffffffffffffdc);
    if ((uVar6 & 0x1000000) == 0) {
      ImGui::PopDisabled();
    }
    ImGui::EndMenu();
  }
  return;
}

Assistant:

void LightingMenuItems(const std::shared_ptr<myvk::CommandPool> &command_pool,
                       const std::shared_ptr<Lighting> &lighting, const char **open_modal) {
	if (ImGui::BeginMenu("Light")) {
		auto type = lighting->m_light_type;
		bool active;

		{
			active = type == Lighting::LightTypes::kConstantColor;
			if (ImGui::RadioButton("Constant Color", active))
				lighting->m_light_type = Lighting::LightTypes::kConstantColor;

			if (!active)
				ImGui::PushDisabled();
			ImGui::DragFloat3("", &lighting->m_sun_radiance[0], 0.1f, 0.0f, kMaxConstantColor);
			if (!active)
				ImGui::PopDisabled();
		}

		ImGui::Separator();

		{
			active = type == Lighting::LightTypes::kEnvironmentMap;
			if (ImGui::RadioButton("Environment Map", active))
				lighting->m_light_type = Lighting::LightTypes::kEnvironmentMap;

			if (!active)
				ImGui::PushDisabled();
			if (ImGui::Button("Load"))
				*open_modal = kLightingLoadEnvMapModal;
			if (!lighting->GetEnvironmentMapPtr()->Empty()) {
				ImGui::SameLine();
				if (ImGui::Button("Unload")) {
					command_pool->GetQueuePtr()->WaitIdle();
					lighting->GetEnvironmentMapPtr()->Reset();
				} else {
					ImGui::SameLine();
					ImGui::Text("(%d x %d)", lighting->GetEnvironmentMapPtr()->GetImageExtent().width,
					            lighting->GetEnvironmentMapPtr()->GetImageExtent().height);
				}
			}
			ImGui::InputFloat("Multiplier", &lighting->GetEnvironmentMapPtr()->m_multiplier);
			if (lighting->GetEnvironmentMapPtr()->m_multiplier < 0.0f)
				lighting->GetEnvironmentMapPtr()->m_multiplier = 0.0f;
			ImGui::DragAngle("Rotation", &lighting->GetEnvironmentMapPtr()->m_rotation, 1, 0, 360);
			if (!active)
				ImGui::PopDisabled();
		}

		ImGui::EndMenu();
	}
}